

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void base64_encode_binary(uchar *in,char *out,int len)

{
  ulong uVar1;
  uchar *puVar2;
  int iVar3;
  uchar *__ptr;
  long lVar4;
  uchar uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long olen;
  
  uVar7 = (ulong)len;
  olen = compressBound(uVar7);
  __ptr = (uchar *)malloc(olen);
  iVar3 = compress2(__ptr,&olen,in,uVar7,9);
  if (iVar3 != 0) {
    panic("Could not compress input data!");
  }
  uVar6 = 0;
  iVar3 = sprintf(out,"$%d$",(ulong)(uint)len);
  uVar8 = (ulong)iVar3;
  uVar1 = olen;
  puVar2 = __ptr;
  if (uVar7 <= olen + uVar8) {
    uVar8 = uVar6;
    uVar1 = uVar7;
    puVar2 = in;
  }
  lVar4 = uVar8 << 0x20;
  for (; uVar6 < uVar1 - uVar1 % 3; uVar6 = uVar6 + 3) {
    out[uVar8] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [puVar2[uVar6] >> 2];
    out[uVar8 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(puVar2[uVar6 + 1] >> 4) | (puVar2[uVar6] & 3) << 4];
    out[uVar8 + 2] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(puVar2[uVar6 + 2] >> 6) + (puVar2[uVar6 + 1] & 0xf) * 4];
    out[uVar8 + 3] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [puVar2[uVar6 + 2] & 0x3f];
    uVar8 = uVar8 + 4;
    lVar4 = lVar4 + 0x400000000;
  }
  iVar3 = (int)uVar6;
  if (0 < (int)uVar1 - iVar3) {
    lVar4 = lVar4 >> 0x20;
    out[lVar4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [puVar2[uVar6] >> 2];
    uVar7 = (ulong)((puVar2[uVar6] & 3) << 4);
    if ((int)uVar1 + -1 == iVar3) {
      out[lVar4 + 1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar7];
      uVar5 = '=';
    }
    else {
      out[lVar4 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [puVar2[iVar3 + 1U] >> 4 | uVar7];
      uVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)(puVar2[iVar3 + 1U] & 0xf) * 4];
    }
    out[lVar4 + 2] = uVar5;
    out[lVar4 + 3] = '=';
    uVar8 = uVar8 + 4;
  }
  free(__ptr);
  out[(int)uVar8] = '\0';
  return;
}

Assistant:

static void base64_encode_binary(const unsigned char* in, char *out, int len)
{
    int i, pos, rem;
    unsigned long olen = compressBound(len);
    unsigned char *o = malloc(olen);

    if (compress2(o, &olen, in, len, Z_BEST_COMPRESSION) != Z_OK)
	panic("Could not compress input data!");

    pos = sprintf(out, "$%d$", len);
    if (pos + olen >= len) {
	pos = 0;
	olen = len;
    } else {
	in = o;
    }

    for (i = 0; i < (olen / 3) * 3; i += 3) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 | (in[i+1] & 0xf0) >> 4];
	out[pos+2] = b64e[(in[i+1] & 0x0f) << 2 | (in[i+2] & 0xc0) >> 6];
	out[pos+3] = b64e[ in[i+2] & 0x3f];
	pos += 4;
    }

    rem = olen - i;
    if (rem > 0) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 |
			 (rem == 1 ? 0 :
			  (in[i+1] & 0xf0) >> 4)];
	out[pos+2] = (rem == 1) ? '=' :
		     b64e[(in[i+1] & 0x0f) << 2];
	out[pos+3] = '=';
	pos += 4;
    }

    free(o);

    out[pos] = '\0';
}